

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_copy(mbedtls_mpi *X,mbedtls_mpi *Y)

{
  ulong nblimbs;
  ulong local_30;
  size_t i;
  int ret;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  
  i._4_4_ = 0;
  if (X == Y) {
    return 0;
  }
  if (Y->n == 0) {
    mbedtls_mpi_free(X);
    return 0;
  }
  local_30 = Y->n;
  do {
    nblimbs = local_30;
    local_30 = nblimbs - 1;
    if (local_30 == 0) break;
  } while (Y->p[local_30] == 0);
  X->s = Y->s;
  if (X->n < nblimbs) {
    i._4_4_ = mbedtls_mpi_grow(X,nblimbs);
    if (i._4_4_ != 0) {
      return i._4_4_;
    }
  }
  else {
    memset(X->p + nblimbs,0,(X->n - nblimbs) * 8);
  }
  memcpy(X->p,Y->p,nblimbs * 8);
  return i._4_4_;
}

Assistant:

int mbedtls_mpi_copy( mbedtls_mpi *X, const mbedtls_mpi *Y )
{
    int ret = 0;
    size_t i;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( Y != NULL );

    if( X == Y )
        return( 0 );

    if( Y->n == 0 )
    {
        mbedtls_mpi_free( X );
        return( 0 );
    }

    for( i = Y->n - 1; i > 0; i-- )
        if( Y->p[i] != 0 )
            break;
    i++;

    X->s = Y->s;

    if( X->n < i )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i ) );
    }
    else
    {
        memset( X->p + i, 0, ( X->n - i ) * ciL );
    }

    memcpy( X->p, Y->p, i * ciL );

cleanup:

    return( ret );
}